

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O2

CURLcode Curl_sha512_256it(uchar *output,uchar *input,size_t input_size)

{
  CURLcode CVar1;
  CURLcode CVar2;
  Curl_sha512_256_ctx ctx;
  undefined1 local_30 [8];
  
  CVar1 = Curl_sha512_256_init(local_30);
  if (CVar1 == CURLE_OK) {
    CVar2 = Curl_sha512_256_update(local_30,input,input_size);
    CVar1 = Curl_sha512_256_finish(output,local_30);
    if (CVar2 != CURLE_OK) {
      CVar1 = CVar2;
    }
  }
  return CVar1;
}

Assistant:

CURLcode
Curl_sha512_256it(unsigned char *output, const unsigned char *input,
                  size_t input_size)
{
  Curl_sha512_256_ctx ctx;
  CURLcode res;

  res = Curl_sha512_256_init(&ctx);
  if(res != CURLE_OK)
    return res;

  res = Curl_sha512_256_update(&ctx, (const void *) input, input_size);

  if(res != CURLE_OK) {
    (void) Curl_sha512_256_finish(output, &ctx);
    return res;
  }

  return Curl_sha512_256_finish(output, &ctx);
}